

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

int __thiscall
kj::ArrayBuilder<capnp::JsonCodec::AnnotatedHandler::FlattenedField>::truncate
          (ArrayBuilder<capnp::JsonCodec::AnnotatedHandler::FlattenedField> *this,char *__file,
          __off_t __length)

{
  FlattenedField *pFVar1;
  FlattenedField *pFVar2;
  FlattenedField *pFVar3;
  char *pcVar4;
  size_t sVar5;
  ArrayDisposer *pAVar6;
  uint in_EAX;
  
  pFVar2 = this->ptr;
  pFVar3 = this->pos;
  while (pFVar2 + (long)__file < pFVar3) {
    pFVar1 = pFVar3 + -1;
    this->pos = pFVar1;
    capnp::DynamicValue::Reader::~Reader(&pFVar3[-1].value);
    in_EAX = pFVar3[-1].type.tag - 1;
    if (in_EAX < 2) {
      pFVar3[-1].type.tag = 0;
    }
    pcVar4 = (pFVar1->ownName).content.ptr;
    if (pcVar4 != (char *)0x0) {
      sVar5 = pFVar3[-1].ownName.content.size_;
      (pFVar1->ownName).content.ptr = (char *)0x0;
      pFVar3[-1].ownName.content.size_ = 0;
      pAVar6 = pFVar3[-1].ownName.content.disposer;
      in_EAX = (**pAVar6->_vptr_ArrayDisposer)(pAVar6,pcVar4,1,sVar5,sVar5,0);
    }
    pFVar3 = this->pos;
  }
  return in_EAX;
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (__has_trivial_destructor(T)) {
      pos = target;
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }